

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileTree.cpp
# Opt level: O1

PCASC_FILE_NODE __thiscall
CASC_FILE_TREE::Find(CASC_FILE_TREE *this,char *szFullPath,PDWORD PtrFileSize)

{
  DWORD DVar1;
  int iVar2;
  PCASC_FILE_NODE p_Var3;
  DWORD DataId;
  ULONGLONG FileNameHash;
  DWORD local_28;
  BYTE local_24 [4];
  ULONGLONG local_20;
  
  local_20 = CalcFileNameHash(szFullPath);
  local_28 = 0xffffffff;
  p_Var3 = (PCASC_FILE_NODE)Map_FindObject(this->pNameMap,&local_20,(PDWORD)0x0);
  if (p_Var3 == (PCASC_FILE_NODE)0x0) {
    if ((((this->DataIdOffset != 0) && (AsciiToUpperTable_BkSlash[*szFullPath] == 'F')) &&
        (AsciiToUpperTable_BkSlash[szFullPath[1]] == 'I')) &&
       ((AsciiToUpperTable_BkSlash[szFullPath[2]] == 'L' &&
        (AsciiToUpperTable_BkSlash[szFullPath[3]] == 'E')))) {
      iVar2 = ConvertStringToBinary(szFullPath + 4,8,local_24);
      if ((iVar2 == 0) && ((szFullPath[0xc] == '.' || (szFullPath[0xc] == '\0')))) {
        local_28 = ConvertBytesToInteger_4(local_24);
        if (local_28 != 0xffffffff) {
          p_Var3 = (PCASC_FILE_NODE)Map_FindObject(this->pIdMap,&local_28,(PDWORD)0x0);
          goto LAB_0010f58f;
        }
      }
    }
    p_Var3 = (PCASC_FILE_NODE)0x0;
  }
LAB_0010f58f:
  if ((((PtrFileSize != (PDWORD)0x0) && (p_Var3 != (PCASC_FILE_NODE)0x0)) &&
      (this->FileSizeOffset != 0)) &&
     (DVar1 = *(DWORD *)((p_Var3->CKey).Value + this->FileSizeOffset), DVar1 != 0xffffffff)) {
    *PtrFileSize = DVar1;
  }
  return p_Var3;
}

Assistant:

PCASC_FILE_NODE CASC_FILE_TREE::Find(const char * szFullPath, PDWORD PtrFileSize)
{
    PCASC_FILE_NODE pFileNode;
    ULONGLONG FileNameHash = CalcFileNameHash(szFullPath);
    DWORD DataId = CASC_INVALID_ID;

    // Lookup the path in the name map
    pFileNode = (PCASC_FILE_NODE)Map_FindObject(pNameMap, &FileNameHash);
    if(pFileNode == NULL && DataIdOffset != 0 && IsFileDataIdName(szFullPath, DataId))
    {
        pFileNode = (PCASC_FILE_NODE)Map_FindObject(pIdMap, &DataId);
    }

    // Did we find anything?
    if(pFileNode != NULL && FileSizeOffset != 0)
    {
        GetExtras(pFileNode, NULL, PtrFileSize, NULL);
    }

    return pFileNode;
}